

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O0

duckdb_logical_type duckdb_create_enum_type(char **member_names,idx_t member_count)

{
  string_t data;
  Vector *pVVar1;
  LogicalType *other;
  ulong in_RSI;
  long in_RDI;
  anon_struct_16_3_d7536bce_for_pointer aVar2;
  LogicalType *mtype;
  idx_t i;
  string_t *enum_vector_ptr;
  Vector enum_vector;
  char *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  Vector *vector;
  undefined7 uVar3;
  LogicalTypeId id;
  LogicalType *in_stack_ffffffffffffff00;
  idx_t in_stack_ffffffffffffff10;
  LogicalType *in_stack_ffffffffffffff18;
  LogicalType *pLVar4;
  Vector *in_stack_ffffffffffffff20;
  ulong local_b8;
  undefined1 local_98 [128];
  ulong local_18;
  long local_10;
  LogicalType *local_8;
  
  if (in_RDI == 0) {
    local_8 = (LogicalType *)0x0;
  }
  else {
    uVar3 = SUB87(local_98,0);
    id = (LogicalTypeId)((ulong)local_98 >> 0x38);
    local_18 = in_RSI;
    local_10 = in_RDI;
    duckdb::LogicalType::LogicalType(in_stack_ffffffffffffff00,id);
    duckdb::Vector::Vector
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    duckdb::LogicalType::~LogicalType((LogicalType *)0x1912d63);
    pVVar1 = (Vector *)duckdb::FlatVector::GetData<duckdb::string_t>((Vector *)0x1912d70);
    aVar2.ptr = in_stack_fffffffffffffee0;
    aVar2.length = (int)in_stack_fffffffffffffee8;
    aVar2.prefix[0] = (char)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    aVar2.prefix[1] = (char)((ulong)in_stack_fffffffffffffee8 >> 0x28);
    aVar2.prefix[2] = (char)((ulong)in_stack_fffffffffffffee8 >> 0x30);
    aVar2.prefix[3] = (char)((ulong)in_stack_fffffffffffffee8 >> 0x38);
    vector = pVVar1;
    for (local_b8 = 0; local_b8 < local_18; local_b8 = local_b8 + 1) {
      if (*(long *)(local_10 + local_b8 * 8) == 0) {
        local_8 = (LogicalType *)0x0;
        goto LAB_01912f21;
      }
      duckdb::string_t::string_t((string_t *)vector,aVar2._0_8_);
      data.value.pointer.prefix[3] = id;
      data.value._0_7_ = uVar3;
      data.value.pointer.ptr = (char *)in_stack_ffffffffffffff00;
      aVar2 = (anon_struct_16_3_d7536bce_for_pointer)
              duckdb::StringVector::AddStringOrBlob(vector,data);
      *(anon_struct_16_3_d7536bce_for_pointer *)
       ((anon_union_16_2_67f50693_for_value *)&pVVar1->vector_type + local_b8) = aVar2;
    }
    other = (LogicalType *)operator_new(0x18);
    duckdb::LogicalType::LogicalType((LogicalType *)0x1912eab);
    pLVar4 = other;
    duckdb::LogicalType::ENUM(aVar2._0_8_,(idx_t)aVar2.ptr);
    duckdb::LogicalType::operator=((LogicalType *)aVar2.ptr,other);
    duckdb::LogicalType::~LogicalType((LogicalType *)0x1912eeb);
    local_8 = pLVar4;
LAB_01912f21:
    duckdb::Vector::~Vector((Vector *)aVar2.ptr);
  }
  return (duckdb_logical_type)local_8;
}

Assistant:

duckdb_logical_type duckdb_create_enum_type(const char **member_names, idx_t member_count) {
	if (!member_names) {
		return nullptr;
	}
	duckdb::Vector enum_vector(duckdb::LogicalType::VARCHAR, member_count);
	auto enum_vector_ptr = duckdb::FlatVector::GetData<duckdb::string_t>(enum_vector);

	for (idx_t i = 0; i < member_count; i++) {
		if (!member_names[i]) {
			return nullptr;
		}
		enum_vector_ptr[i] = duckdb::StringVector::AddStringOrBlob(enum_vector, member_names[i]);
	}

	duckdb::LogicalType *mtype = new duckdb::LogicalType;
	*mtype = duckdb::LogicalType::ENUM(enum_vector, member_count);
	return reinterpret_cast<duckdb_logical_type>(mtype);
}